

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
* __thiscall
hta::Metric::retrieve_flex
          (variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
           *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end,
          Duration interval_upper_limit,IntervalScope scope,bool smooth)

{
  Aggregate aggregate;
  initializer_list<hta::Row> __l;
  bool bVar1;
  rep rVar2;
  IntervalScope *pIVar3;
  pointer pMVar4;
  type tVar5;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> local_268;
  int64_t local_250;
  rep local_248;
  rep local_240;
  rep local_238;
  vector<hta::Row,_std::allocator<hta::Row>_> local_230;
  int local_214;
  Metric *pMStack_210;
  int smooth_factor;
  rep local_208;
  rep local_200;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1f8;
  undefined1 local_1f0 [8];
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> result;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1a8;
  Duration interval;
  vector<hta::Row,_std::allocator<hta::Row>_> local_188;
  size_type local_170;
  duration<long,_std::ratio<1L,_1000000000L>_> local_168;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> local_160;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> average_interval;
  undefined1 local_138 [8];
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> raw_ts;
  allocator<hta::Row> local_109;
  rep local_108;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_100;
  Aggregate local_f8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_c8;
  Duration local_c0;
  Row local_b8;
  Row *local_78;
  size_type local_70;
  vector<hta::Row,_std::allocator<hta::Row>_> local_68;
  rep local_50;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_48;
  byte local_39;
  Metric *pMStack_38;
  bool smooth_local;
  Metric *this_local;
  IntervalScope scope_local;
  Duration interval_upper_limit_local;
  TimePoint end_local;
  TimePoint begin_local;
  
  local_39 = smooth;
  pMStack_38 = this;
  this_local = (Metric *)scope;
  scope_local = (IntervalScope)interval_upper_limit.__r;
  interval_upper_limit_local.__r =
       (rep)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
  end_local = begin;
  check_read(this);
  bVar1 = std::chrono::operator>
                    (&end_local.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&interval_upper_limit_local);
  if (((bVar1) && ((int)this_local != 3)) && (this_local._4_4_ != 3)) {
    local_48.__d.__r =
         (duration)
         (duration)
         end_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_50 = interval_upper_limit_local.__r;
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("Metric::retrieve(interval_upper_limit) invalid request: begin timestamp ",
               (time_point)
               end_local.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",(time_point)interval_upper_limit_local.__r);
  }
  rVar2 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
  if (rVar2 < 0) {
    local_c0.__r = (rep)std::chrono::operator-
                                  ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&interval_upper_limit_local,
                                   &end_local.
                                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  );
    local_c8.__d.__r =
         (duration)
         (duration)
         end_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_100.__d.__r =
         (duration)
         (duration)
         end_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_108 = interval_upper_limit_local.__r;
    Metric::aggregate(&local_f8,this,end_local,(TimePoint)interval_upper_limit_local.__r);
    aggregate.maximum = local_f8.maximum;
    aggregate.minimum = local_f8.minimum;
    aggregate.sum = local_f8.sum;
    aggregate.count = local_f8.count;
    aggregate.integral = local_f8.integral;
    aggregate.active_time.__r = local_f8.active_time.__r;
    Row::Row(&local_b8,local_c0,(TimePoint)local_c8.__d.__r,aggregate);
    local_70 = 1;
    local_78 = &local_b8;
    std::allocator<hta::Row>::allocator(&local_109);
    __l._M_len = local_70;
    __l._M_array = local_78;
    std::vector<hta::Row,_std::allocator<hta::Row>_>::vector(&local_68,__l,&local_109);
    std::
    variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
    ::
    variant<std::vector<hta::Row,std::allocator<hta::Row>>,void,void,std::vector<hta::Row,std::allocator<hta::Row>>,void>
              ((variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                *)__return_storage_ptr__,&local_68);
    std::vector<hta::Row,_std::allocator<hta::Row>_>::~vector(&local_68);
    std::allocator<hta::Row>::~allocator(&local_109);
  }
  else {
    bVar1 = std::chrono::operator<
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local,
                       &this->interval_min_);
    if (bVar1) {
      retrieve((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_138,this,end_local,
               (TimePoint)interval_upper_limit_local.__r,(IntervalScope)this_local);
      bVar1 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::empty
                        ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_138);
      if (bVar1) {
        std::
        variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
        ::
        variant<std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>,void,void,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>,void>
                  ((variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                    *)__return_storage_ptr__,
                   (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_138);
      }
      else {
        local_168.__r =
             (rep)std::chrono::operator-
                            ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&interval_upper_limit_local,
                             &end_local.
                              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            );
        local_170 = std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::size
                              ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_138)
        ;
        local_160 = std::chrono::operator/(&local_168,&local_170);
        bVar1 = std::chrono::operator<
                          (&local_160,(duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
        if ((bVar1) && ((local_39 & 1) != 0)) {
          interval.__r._0_4_ = scope_local.begin;
          interval.__r._4_4_ = scope_local.end;
          convert_timevalues_smooth
                    (&local_188,(vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_138
                     ,end_local,(TimePoint)interval_upper_limit_local.__r,(Duration)scope_local);
          std::
          variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
          ::
          variant<std::vector<hta::Row,std::allocator<hta::Row>>,void,void,std::vector<hta::Row,std::allocator<hta::Row>>,void>
                    ((variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                      *)__return_storage_ptr__,&local_188);
          std::vector<hta::Row,_std::allocator<hta::Row>_>::~vector(&local_188);
        }
        else {
          std::
          variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
          ::
          variant<std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>,void,void,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>,void>
                    ((variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                      *)__return_storage_ptr__,
                     (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_138);
        }
      }
      average_interval.__r._4_4_ = 1;
      std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~vector
                ((vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_138);
    }
    else {
      local_1a8.__r = (this->interval_min_).__r;
      pIVar3 = (IntervalScope *)
               std::min<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local,
                          &this->interval_max_);
      scope_local = *pIVar3;
      while( true ) {
        local_1b0.__r =
             (rep)hta::operator*(local_1a8.__r,(IntervalFactor)(this->interval_factor_).factor_);
        bVar1 = std::chrono::operator<=
                          (&local_1b0,(duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
        if (!bVar1) break;
        result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(this->interval_factor_).factor_;
        local_1a8.__r =
             (rep)hta::operator*(local_1a8.__r,
                                 (IntervalFactor)
                                 result.
                                 super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      do {
        bVar1 = std::chrono::operator<=
                          (&local_1a8,(duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local);
        if (!bVar1) {
          __assert_fail("interval <= interval_upper_limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                        ,0x18c,
                        "std::variant<std::vector<Row>, std::vector<TimeValue>> hta::Metric::retrieve_flex(TimePoint, TimePoint, Duration, IntervalScope, bool)"
                       );
        }
        pMVar4 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
                 operator->(&this->storage_metric_);
        local_1f8.__d.__r =
             (duration)
             (duration)
             end_local.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r;
        local_200 = interval_upper_limit_local.__r;
        local_208 = local_1a8.__r;
        pMStack_210 = this_local;
        (*pMVar4->_vptr_Metric[6])
                  (local_1f0,pMVar4,
                   end_local.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r,interval_upper_limit_local.__r,local_1a8.__r,this_local);
        bVar1 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::empty
                          ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                           local_1f0);
        if (bVar1) {
          local_248 = local_1a8.__r;
          local_250 = (this->interval_factor_).factor_;
          local_240 = (rep)operator/(local_1a8.__r,(IntervalFactor)local_250);
          average_interval.__r._4_4_ = 0;
          local_1a8.__r = local_240;
        }
        else {
          local_214 = 1;
          if ((local_39 & 1) != 0) {
            tVar5 = std::chrono::operator/
                              ((duration<long,_std::ratio<1L,_1000000000L>_> *)&scope_local,
                               &local_1a8);
            local_214 = (int)tVar5;
          }
          local_238 = local_1a8.__r;
          convert_timeaggregates_to_rows
                    (&local_230,
                     (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_1f0,
                     (Duration)local_1a8.__r,local_214);
          std::
          variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
          ::
          variant<std::vector<hta::Row,std::allocator<hta::Row>>,void,void,std::vector<hta::Row,std::allocator<hta::Row>>,void>
                    ((variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                      *)__return_storage_ptr__,&local_230);
          std::vector<hta::Row,_std::allocator<hta::Row>_>::~vector(&local_230);
          average_interval.__r._4_4_ = 1;
        }
        std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~vector
                  ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_1f0);
        if (average_interval.__r._4_4_ != 0) {
          return __return_storage_ptr__;
        }
        bVar1 = std::chrono::operator>=(&local_1a8,&this->interval_min_);
      } while (bVar1);
      memset(&local_268,0,0x18);
      std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::vector(&local_268);
      std::
      variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
      ::
      variant<std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>,void,void,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>,void>
                ((variant<std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                  *)__return_storage_ptr__,&local_268);
      std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~vector(&local_268);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::variant<std::vector<Row>, std::vector<TimeValue>>
Metric::retrieve_flex(TimePoint begin, TimePoint end, Duration interval_upper_limit,
                      IntervalScope scope, bool smooth)
{
    check_read();
    if (begin > end && scope.begin != Scope::infinity && scope.end != Scope::infinity)
    {
        throw_exception("Metric::retrieve(interval_upper_limit) invalid request: begin timestamp ",
                        begin, " larger than end timestamp ", end);
    }
    if (interval_upper_limit.count() < 0)
    {
        // Get single aggregate
        return std::vector<Row>{ Row(end - begin, begin, aggregate(begin, end)) };
    }
    if (interval_upper_limit < interval_min_)
    {
        // Use raw data
        auto raw_ts = retrieve(begin, end, scope);
        if (raw_ts.empty())
        {
            return raw_ts;
        }
        auto average_interval = (end - begin) / raw_ts.size();
        if (average_interval < interval_upper_limit && smooth)
        {
            // too many raw data points, must reduce
            // TODO respect scope
            return convert_timevalues_smooth(raw_ts, begin, end, interval_upper_limit);
        }
        return raw_ts;
    }
    auto interval = interval_min_;
    interval_upper_limit = std::min(interval_upper_limit, interval_max_);
    while (interval * interval_factor_ <= interval_upper_limit)
    {
        interval = interval * interval_factor_;
    }
    do
    {
        assert(interval <= interval_upper_limit);
        auto result = storage_metric_->get(begin, end, interval, scope);
        if (!result.empty())
        {
            int smooth_factor = 1;
            if (smooth)
            {
                smooth_factor = interval_upper_limit / interval;
            }
            return convert_timeaggregates_to_rows(result, interval, smooth_factor);
        }
        // If the requested level has no data yet, we must ask the lower levels
        interval = interval / interval_factor_;
    } while (interval >= interval_min_);
    // No data at all
    return std::vector<TimeValue>{};
}